

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::save_load_memory_tree(memory_tree *b,io_buf *model_file,bool read,bool text)

{
  v_array<memory_tree_ns::node> *this;
  int *oas;
  vw *pvVar1;
  bool bVar2;
  memory_tree *pmVar3;
  ostream *poVar4;
  ulong uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  v_array<example_*> *this_00;
  size_t n_nodes;
  size_t n_examples;
  example *new_ec;
  stringstream msg;
  bool local_22a;
  bool local_229;
  io_buf *local_228;
  ulong local_220;
  node local_218;
  memory_tree *local_1c8;
  example *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_22a = text;
  local_229 = read;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_228 = model_file;
  if ((model_file->files)._end != (model_file->files)._begin) {
    if (read) {
      b->test_mode = true;
      local_218.parent = 0;
      local_218.internal = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"stride_shift",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (read) {
        io_buf::bin_read_fixed(local_228,(char *)&local_218,8,"");
      }
      else {
        bin_text_write_fixed(local_228,(char *)&local_218,8,(stringstream *)local_1b8,text);
      }
      pvVar1 = b->all;
      if ((pvVar1->weights).sparse == true) {
        sparse_parameters::stride_shift(&(pvVar1->weights).sparse_weights,local_218.parent);
      }
      else {
        (pvVar1->weights).dense_weights._stride_shift = local_218.parent;
      }
    }
    else {
      pvVar1 = b->all;
      puVar6 = &(pvVar1->weights).dense_weights._stride_shift;
      if ((pvVar1->weights).sparse != false) {
        puVar6 = &(pvVar1->weights).sparse_weights._stride_shift;
      }
      local_218._0_8_ = ZEXT48(*puVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"stride_shift",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (read) {
        io_buf::bin_read_fixed(local_228,(char *)&local_218,8,"");
      }
      else {
        bin_text_write_fixed(local_228,(char *)&local_218,8,(stringstream *)local_1b8,text);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"max_nodes",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (read) {
      io_buf::bin_read_fixed(local_228,(char *)&b->max_nodes,8,"");
    }
    else {
      bin_text_write_fixed(local_228,(char *)&b->max_nodes,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"learn_at_leaf",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,b->learn_at_leaf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (read) {
      io_buf::bin_read_fixed(local_228,(char *)&b->learn_at_leaf,4,"");
    }
    else {
      bin_text_write_fixed(local_228,(char *)&b->learn_at_leaf,4,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"oas",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,b->oas);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    oas = &b->oas;
    if (read) {
      io_buf::bin_read_fixed(local_228,(char *)oas,4,"");
    }
    else {
      bin_text_write_fixed(local_228,(char *)oas,4,(stringstream *)local_1b8,text);
    }
    local_220 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * -0x71c71c71c71c71c7;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"nodes",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (read) {
      io_buf::bin_read_fixed(local_228,(char *)&local_220,8,"");
    }
    else {
      bin_text_write_fixed(local_228,(char *)&local_220,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"max_number_of_labels",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if (read) {
      io_buf::bin_read_fixed(local_228,(char *)&b->max_num_labels,8,"");
    }
    else {
      bin_text_write_fixed(local_228,(char *)&b->max_num_labels,8,(stringstream *)local_1b8,text);
    }
    this = &b->nodes;
    local_1c8 = b;
    if (read) {
      v_array<memory_tree_ns::node>::clear(this);
      if (local_220 != 0) {
        uVar5 = 1;
        do {
          local_218.parent = 0;
          local_218.internal = 0;
          local_218.depth = 0;
          local_218.base_router = 0;
          local_218.left = 0;
          local_218.right = 0;
          local_218.nl = 0.001;
          local_218.nr = 0.001;
          local_218.examples_index.end_array = (uint *)0x0;
          local_218.examples_index.erase_count = 0;
          local_218.examples_index._begin = (uint *)0x0;
          local_218.examples_index._end = (uint *)0x0;
          v_array<memory_tree_ns::node>::push_back(this,&local_218);
          bVar2 = uVar5 < local_220;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
      }
    }
    if (local_220 != 0) {
      uVar5 = 0;
      uVar7 = 1;
      do {
        save_load_node(this->_begin + uVar5,local_228,&local_229,&local_22a,
                       (stringstream *)local_1b8);
        bVar2 = uVar7 < local_220;
        uVar5 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar2);
    }
    pmVar3 = local_1c8;
    local_218._0_8_ = (long)(local_1c8->examples)._end - (long)(local_1c8->examples)._begin >> 3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"examples",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    bVar2 = local_229;
    if (local_229 == true) {
      io_buf::bin_read_fixed(local_228,(char *)&local_218,8,"");
    }
    else {
      bin_text_write_fixed(local_228,(char *)&local_218,8,(stringstream *)local_1b8,local_22a);
    }
    this_00 = &pmVar3->examples;
    if (bVar2 != false) {
      v_array<example_*>::clear(this_00);
      if (local_218._0_8_ != 0) {
        uVar5 = 1;
        do {
          local_1c0 = calloc_or_throw<example>(1);
          v_array<example_*>::push_back(this_00,&local_1c0);
          bVar2 = uVar5 < (ulong)local_218._0_8_;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
      }
    }
    if (local_218._0_8_ != 0) {
      uVar5 = 0;
      uVar7 = 1;
      do {
        save_load_example(this_00->_begin[uVar5],local_228,&local_229,&local_22a,
                          (stringstream *)local_1b8,oas);
        bVar2 = uVar7 < (ulong)local_218._0_8_;
        uVar5 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar2);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void save_load_memory_tree(memory_tree& b, io_buf& model_file, bool read, bool text)
    {
        stringstream msg;
        if (model_file.files.size() > 0){
            if (read)
                b.test_mode = true;

            if (read)
            {
                size_t ss = 0;
                writeit(ss, "stride_shift");
                b.all->weights.stride_shift(ss);
            }
            else
            {
                size_t ss = b.all->weights.stride_shift();
                writeit(ss, "stride_shift");
            }
            
            writeit(b.max_nodes, "max_nodes");
            writeit(b.learn_at_leaf, "learn_at_leaf");
            writeit(b.oas, "oas");
	        //writeit(b.leaf_example_multiplier, "leaf_example_multiplier")
            writeitvar(b.nodes.size(), "nodes", n_nodes); 
            writeit(b.max_num_labels, "max_number_of_labels");

            if (read){
                b.nodes.clear();
                for (uint32_t i = 0; i < n_nodes; i++)
                    b.nodes.push_back(node());
            }
            
            //node  
            for(uint32_t i = 0; i < n_nodes; i++){
                save_load_node(b.nodes[i], model_file, read, text, msg);
            }
            //deal with examples:
            writeitvar(b.examples.size(), "examples", n_examples);
            if (read){
                b.examples.clear();
                for (uint32_t i = 0; i < n_examples; i++){
                    example* new_ec = &calloc_or_throw<example>();
                    b.examples.push_back(new_ec);
                }
            }
            for (uint32_t i = 0; i < n_examples; i++)
                save_load_example(b.examples[i], model_file, read, text, msg, b.oas);
	    //cout<<"done loading...."<<endl;
            
            
        }
    }